

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O1

void __thiscall
TPZCompElH1<pzshape::TPZShapePrism>::~TPZCompElH1
          (TPZCompElH1<pzshape::TPZShapePrism> *this,void **vtt)

{
  void *pvVar1;
  TPZGeoEl *pTVar2;
  TPZConnect *pTVar3;
  long lVar4;
  TPZStack<long,_10> connectlist;
  TPZManVector<long,_10> TStack_98;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.super_TPZCompEl = pvVar1;
  *(void **)(&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
              super_TPZInterpolationSpace.super_TPZCompEl.field_0x0 +
            *(long *)((long)pvVar1 + -0x60)) = vtt[9];
  pTVar2 = TPZCompEl::Reference((TPZCompEl *)this);
  if (pTVar2 != (TPZGeoEl *)0x0) {
    if ((TPZCompElH1<pzshape::TPZShapePrism> *)pTVar2->fReference == this) {
      (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                             super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                             super_TPZCompEl + 0x358))(this,1);
    }
    pTVar2 = TPZCompEl::Reference((TPZCompEl *)this);
    pTVar2->fReference = (TPZCompEl *)0x0;
  }
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&TStack_98);
  (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                         super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl +
              0x1e0))(this,&TStack_98);
  if (0 < TStack_98.super_TPZVec<long>.fNElements) {
    lVar4 = 0;
    do {
      if (TStack_98.super_TPZVec<long>.fStore[lVar4] != -1) {
        pTVar3 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(((this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                               super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                               super_TPZCompEl.fMesh)->fConnectVec).
                             super_TPZChunkVector<TPZConnect,_10>,
                            TStack_98.super_TPZVec<long>.fStore[lVar4]);
        pTVar3->fNElConnected = pTVar3->fNElConnected + -1;
      }
      lVar4 = lVar4 + 1;
    } while (TStack_98.super_TPZVec<long>.fNElements != lVar4);
  }
  TPZManVector<long,_10>::~TPZManVector(&TStack_98);
  TPZManVector<long,_21>::~TPZManVector(&this->fConnectIndexes);
  pvVar1 = vtt[1];
  *(void **)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.super_TPZCompEl = pvVar1;
  *(void **)(&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
              super_TPZInterpolationSpace.super_TPZCompEl.field_0x0 +
            *(long *)((long)pvVar1 + -0x60)) = vtt[8];
  TPZIntPrism3D::~TPZIntPrism3D(&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).fIntRule);
  TPZInterpolatedElement::~TPZInterpolatedElement((TPZInterpolatedElement *)this,vtt + 2);
  return;
}

Assistant:

TPZCompElH1<TSHAPE>::~TPZCompElH1() {
    TPZGeoEl *gel = this->Reference();
    if (gel) {
        TPZCompEl *cel = gel->Reference();
        if (cel == this) {
            this->RemoveSideRestraintsII(this->EDelete);
        }
        this->Reference()->ResetReference();
    }
    TPZStack<int64_t > connectlist;
    this->BuildConnectList(connectlist);
    int64_t nconnects = connectlist.size();
    for (int ic = 0; ic < nconnects; ic++) {
        if (connectlist[ic] != -1){
            this->fMesh->ConnectVec()[connectlist[ic]].DecrementElConnected();
        }
    }
}